

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprDataType(Expr *pExpr)

{
  u8 uVar1;
  int iVar2;
  Select *pSVar3;
  char cVar4;
  uint uVar5;
  Expr *pExpr_00;
  ulong uVar6;
  uint uVar7;
  Select **ppSVar8;
  uint uVar9;
  long lVar10;
  
  uVar9 = 0;
LAB_0017d70b:
  lVar10 = 1;
  do {
    pExpr_00 = pExpr;
    if (pExpr_00 == (Expr *)0x0) {
      uVar7 = 0;
      goto LAB_0017d7e4;
    }
    uVar1 = pExpr_00->op;
    switch(uVar1) {
    case 0x9b:
      uVar7 = 4;
      goto LAB_0017d7e4;
    case 0x9c:
    case 0x9f:
    case 0xa0:
    case 0xa1:
    case 0xa2:
    case 0xa3:
    case 0xa4:
    case 0xa5:
    case 0xa6:
    case 0xa7:
    case 0xab:
    case 0xae:
    case 0xaf:
    case 0xb0:
      goto switchD_0017d72f_caseD_9c;
    case 0x9d:
    case 0xa9:
    case 0xac:
      uVar7 = 7;
      goto LAB_0017d7e4;
    case 0x9e:
      goto switchD_0017d72f_caseD_9e;
    case 0xa8:
    case 0xaa:
    case 0xb1:
    case 0xb2:
      goto switchD_0017d72f_caseD_a8;
    case 0xad:
    case 0xb3:
switchD_0017d72f_caseD_ad:
      pExpr = pExpr_00->pLeft;
      break;
    default:
      if (uVar1 == 'r') goto switchD_0017d72f_caseD_ad;
      pExpr = (Expr *)0x0;
      if (uVar1 != 'z') {
        if (uVar1 != '$') {
          if (uVar1 == 'p') {
            uVar7 = 6;
            goto LAB_0017d7e4;
          }
          uVar7 = 2;
          if (uVar1 == 'v') goto LAB_0017d7e4;
          if (uVar1 != 0x8b) {
switchD_0017d72f_caseD_9c:
            uVar7 = 1;
            goto LAB_0017d7e4;
          }
        }
switchD_0017d72f_caseD_a8:
        cVar4 = sqlite3ExprAffinity(pExpr_00);
        uVar7 = 5;
        if (cVar4 < 'C') {
          uVar7 = cVar4 == 'B' ^ 7;
        }
        goto LAB_0017d7e4;
      }
    }
  } while( true );
switchD_0017d72f_caseD_9e:
  pSVar3 = (pExpr_00->x).pSelect;
  ppSVar8 = (Select **)&pSVar3->pEList;
  uVar7 = 0;
  for (; iVar2._0_1_ = pSVar3->op, iVar2._1_1_ = pSVar3->field_0x1, iVar2._2_2_ = pSVar3->nSelectRow
      , uVar6 = (ulong)iVar2, lVar10 < (long)uVar6; lVar10 = lVar10 + 2) {
    uVar5 = sqlite3ExprDataType((Expr *)*ppSVar8);
    uVar7 = uVar7 | uVar5;
    ppSVar8 = ppSVar8 + 6;
  }
  if ((uVar6 & 1) == 0) {
LAB_0017d7e4:
    return uVar7 | uVar9;
  }
  pExpr = *(Expr **)(pSVar3->addrOpenEphm + uVar6 * 6 + -9);
  uVar9 = uVar9 | uVar7;
  goto LAB_0017d70b;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprDataType(const Expr *pExpr){
  while( pExpr ){
    switch( pExpr->op ){
      case TK_COLLATE:
      case TK_IF_NULL_ROW:
      case TK_UPLUS:  {
        pExpr = pExpr->pLeft;
        break;
      }
      case TK_NULL: {
        pExpr = 0;
        break;
      }
      case TK_STRING: {
        return 0x02;
      }
      case TK_BLOB: {
        return 0x04;
      }
      case TK_CONCAT: {
        return 0x06;
      }
      case TK_VARIABLE:
      case TK_AGG_FUNCTION:
      case TK_FUNCTION: {
        return 0x07;
      }
      case TK_COLUMN:
      case TK_AGG_COLUMN:
      case TK_SELECT:
      case TK_CAST:
      case TK_SELECT_COLUMN:
      case TK_VECTOR:  {
        int aff = sqlite3ExprAffinity(pExpr);
        if( aff>=SQLITE_AFF_NUMERIC ) return 0x05;
        if( aff==SQLITE_AFF_TEXT )    return 0x06;
        return 0x07;
      }
      case TK_CASE: {
        int res = 0;
        int ii;
        ExprList *pList = pExpr->x.pList;
        assert( ExprUseXList(pExpr) && pList!=0 );
        assert( pList->nExpr > 0);
        for(ii=1; ii<pList->nExpr; ii+=2){
          res |= sqlite3ExprDataType(pList->a[ii].pExpr);
        }
        if( pList->nExpr % 2 ){
          res |= sqlite3ExprDataType(pList->a[pList->nExpr-1].pExpr);
        }
        return res;
      }
      default: {
        return 0x01;
      }
    } /* End of switch(op) */
  } /* End of while(pExpr) */
  return 0x00;
}